

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint64_t helper_neon_qadd_s64_arm(CPUARMState *env,uint64_t src1,uint64_t src2)

{
  ulong uVar1;
  
  uVar1 = src2 + src1;
  if (-1 < (long)(src2 ^ src1) && (long)(uVar1 ^ src1) < 0) {
    (env->vfp).qc[0] = 1;
    uVar1 = 0x8000000000000000;
    if (-1 < (long)src1) {
      uVar1 = 0x7fffffffffffffff;
    }
  }
  return uVar1;
}

Assistant:

uint64_t HELPER(neon_qadd_s64)(CPUARMState *env, uint64_t src1, uint64_t src2)
{
    uint64_t res;

    res = src1 + src2;
    if (((res ^ src1) & SIGNBIT64) && !((src1 ^ src2) & SIGNBIT64)) {
        SET_QC();
        res = ((int64_t)src1 >> 63) ^ ~SIGNBIT64;
    }
    return res;
}